

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-unix.c
# Opt level: O0

size_t cilkos_validate_stack_size(size_t specified_stack_size)

{
  size_t specified_stack_size_local;
  size_t local_8;
  
  if (specified_stack_size == 0) {
    local_8 = 0x100000;
  }
  else if (specified_stack_size < 0x4001) {
    local_8 = 0x4000;
  }
  else {
    local_8 = specified_stack_size;
    if ((specified_stack_size & 0xfff) != 0) {
      local_8 = ((specified_stack_size >> 0xc) + 1) * 0x1000;
    }
  }
  return local_8;
}

Assistant:

size_t cilkos_validate_stack_size(size_t specified_stack_size) {
    // Convert any negative value to the default.
    if (specified_stack_size == 0) {
        CILK_ASSERT((CILK_DEFAULT_STACK_SIZE % PAGE) == 0);
        return CILK_DEFAULT_STACK_SIZE;
    }
    // Round values in between 0 and CILK_MIN_STACK_SIZE up to
    // CILK_MIN_STACK_SIZE.
    if (specified_stack_size <= CILK_MIN_STACK_SIZE) {
        return CILK_MIN_STACK_SIZE;
    }
    if ((specified_stack_size % PAGE) > 0) {
        // Round the user's stack size value up to nearest page boundary.
        return (PAGE * (1 + specified_stack_size / PAGE));
    }
    return specified_stack_size;
}